

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::BindAlterAddIndex
          (BoundStatement *__return_storage_ptr__,Binder *this,BoundStatement *result,
          CatalogEntry *entry,
          unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *alter_info)

{
  pointer pPVar1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer pLVar6;
  undefined8 uVar7;
  BoundStatement *pBVar8;
  BoundStatement *pBVar9;
  pointer pAVar10;
  ColumnList *pCVar11;
  string *table;
  pointer this_00;
  BoundUniqueConstraint *pBVar12;
  CreateIndexInfo *this_01;
  pointer pCVar13;
  ColumnDefinition *this_02;
  pointer pPVar14;
  pointer this_03;
  UniqueConstraint *pUVar15;
  BaseTableRef *this_04;
  pointer pBVar16;
  pointer this_05;
  LogicalGet *pLVar17;
  BinderException *this_06;
  pointer pPVar18;
  Binder *pBVar19;
  string index_name;
  UniqueConstraint unique_constraint;
  TableDescription table_description;
  _Head_base<0UL,_duckdb::CreateIndexInfo_*,_false> local_1c8;
  undefined1 local_1c0 [32];
  CreateIndexInfo *local_1a0;
  __node_base local_198;
  ColumnList *local_190;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_188;
  undefined1 local_180 [8];
  undefined1 local_178 [32];
  __node_base local_158;
  CatalogEntry *local_150;
  BoundStatement *local_148;
  BoundStatement *local_140;
  pointer local_138;
  Binder *local_130;
  __node_base local_128;
  undefined1 local_120 [32];
  undefined1 local_100 [48];
  bool local_d0;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> local_98 [2];
  _Alloc_hider local_88;
  char local_78 [24];
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  
  pBVar19 = this;
  local_148 = result;
  pAVar10 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                      (alter_info);
  pCVar11 = TableCatalogEntry::GetColumns((TableCatalogEntry *)entry);
  local_128._M_nxt = (_Hash_node_base *)(pAVar10 + 1);
  table = (string *)
          unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator*
                    ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      *)local_128._M_nxt);
  local_1c0._8_8_ = &pAVar10->name;
  local_190 = pCVar11;
  local_138 = pAVar10;
  BindUniqueConstraint
            ((Binder *)local_180,(Constraint *)pBVar19,table,(ColumnList *)local_1c0._8_8_);
  this_00 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
            ::operator->((unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                          *)local_180);
  pBVar12 = BoundConstraint::Cast<duckdb::BoundUniqueConstraint>(this_00);
  this_01 = (CreateIndexInfo *)operator_new(0x240);
  CreateIndexInfo::CreateIndexInfo(this_01);
  local_1c8._M_head_impl = this_01;
  local_158._M_nxt = (_Hash_node_base *)alter_info;
  local_150 = entry;
  local_140 = __return_storage_ptr__;
  local_130 = this;
  pCVar13 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                          *)&local_1c8);
  ::std::__cxx11::string::_M_assign((string *)&pCVar13->table);
  pCVar13 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                          *)&local_1c8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pCVar13->index_type,0,(char *)(pCVar13->index_type)._M_string_length,0x1df9fab)
  ;
  pCVar13 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                          *)&local_1c8);
  pCVar13->constraint_type = PRIMARY;
  pPVar18 = (pBVar12->keys).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (pBVar12->keys).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pPVar18 != pPVar1) {
    do {
      this_02 = ColumnList::GetColumn(local_190,(PhysicalIndex)pPVar18->index);
      ColumnDefinition::GetName_abi_cxx11_((string *)local_c8,this_02);
      make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string,std::__cxx11::string&>
                ((duckdb *)local_120,(string *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c0._8_8_);
      local_100._0_8_ = local_120._0_8_;
      local_120._0_8_ = (_Hash_node_base *)0x0;
      if ((__node_base_ptr)local_c8._0_8_ != (__node_base_ptr)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
      pCVar13 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                              *)&local_1c8);
      pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_100);
      (*(pPVar14->super_BaseExpression)._vptr_BaseExpression[0xc])((string *)local_c8,pPVar14);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pCVar13->expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_c8);
      if ((__node_base_ptr)local_c8._0_8_ != (__node_base_ptr)0x0) {
        (*(code *)(*(_Hash_node_base **)local_c8._0_8_)[1]._M_nxt)();
      }
      pCVar13 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                              *)&local_1c8);
      pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_100);
      (*(pPVar14->super_BaseExpression)._vptr_BaseExpression[0xc])((string *)local_c8,pPVar14);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pCVar13->parsed_expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_c8);
      if ((__node_base_ptr)local_c8._0_8_ != (__node_base_ptr)0x0) {
        (*(code *)(*(_Hash_node_base **)local_c8._0_8_)[1]._M_nxt)();
      }
      if ((ParsedExpression *)local_100._0_8_ != (ParsedExpression *)0x0) {
        (*(code *)((_Hash_node_base *)((BaseExpression *)local_100._0_8_)->_vptr_BaseExpression)[1].
                  _M_nxt)();
      }
      pPVar18 = pPVar18 + 1;
    } while (pPVar18 != pPVar1);
  }
  this_03 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
            operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                        *)local_128._M_nxt);
  pUVar15 = Constraint::Cast<duckdb::UniqueConstraint>(this_03);
  local_100[8] = (pUVar15->super_Constraint).type;
  local_100._0_8_ = &PTR__UniqueConstraint_02440b10;
  local_100._16_8_ = (pUVar15->index).index;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_100 + 0x18),
           &(pUVar15->columns).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  pBVar19 = local_130;
  local_d0 = pUVar15->is_primary_key;
  UniqueConstraint::GetName
            ((string *)local_120,(UniqueConstraint *)local_100,(string *)local_1c0._8_8_);
  pCVar13 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                          *)&local_1c8);
  pBVar9 = local_140;
  ::std::__cxx11::string::_M_assign((string *)&pCVar13->index_name);
  TableDescription::TableDescription
            ((TableDescription *)local_c8,&local_138->catalog,&local_138->schema,
             (string *)local_1c0._8_8_);
  this_04 = (BaseTableRef *)operator_new(0xd0);
  BaseTableRef::BaseTableRef(this_04,(TableDescription *)local_c8);
  local_188._M_head_impl = this_04;
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> *)
             &local_188);
  Bind((Binder *)(local_1c0 + 0x18),(BaseTableRef *)pBVar19);
  pBVar16 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
            operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                        *)(local_1c0 + 0x18));
  if (pBVar16->type == BASE_TABLE) {
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)(local_1c0 + 0x18));
    CreatePlan((Binder *)local_1c0,(BoundTableRef *)pBVar19);
    this_05 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_1c0);
    pLVar17 = LogicalOperator::Cast<duckdb::LogicalGet>(this_05);
    ColumnList::GetColumnNames_abi_cxx11_(&local_48,local_190);
    local_178._16_8_ =
         (pLVar17->names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pLVar17->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178._0_8_ =
         (pLVar17->names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_178._8_8_ =
         (pLVar17->names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pLVar17->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pLVar17->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_180 + 8));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    local_1c0._16_8_ =
         (((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_> *)
          &(local_158._M_nxt)->_M_nxt)->_M_t).
         super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
         super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_> *)
     &(local_158._M_nxt)->_M_nxt)->_M_t).
    super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
    super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)0x0;
    local_198._M_nxt = (_Hash_node_base *)local_1c0._0_8_;
    local_1c0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    local_1a0 = local_1c8._M_head_impl;
    local_1c8._M_head_impl = (CreateIndexInfo *)0x0;
    (**(code **)(*local_150[1]._vptr_CatalogEntry + 0x90))
              (local_180 + 8,local_150[1]._vptr_CatalogEntry,pBVar19);
    pBVar8 = local_148;
    uVar7 = local_178._0_8_;
    local_178._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (local_148->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (local_148->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar7;
    if (_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_178._0_8_)[1])();
      }
    }
    local_178._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((ClientContext *)local_1c0._16_8_ != (ClientContext *)0x0) {
      (*((ParseInfo *)local_1c0._16_8_)->_vptr_ParseInfo[1])();
    }
    local_1c0._16_8_ = (ClientContext *)0x0;
    if (local_1a0 != (CreateIndexInfo *)0x0) {
      (*(local_1a0->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    local_1a0 = (CreateIndexInfo *)0x0;
    if ((element_type *)local_198._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_198._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_198._M_nxt = (_Hash_node_base *)0x0;
    (pBVar9->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (LogicalOperator *)
         (pBVar8->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (pBVar8->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    pLVar6 = (pBVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (pBVar9->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pBVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    (pBVar9->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar6;
    (pBVar9->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pBVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pBVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar3 = *(undefined4 *)
             ((long)&(pBVar8->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar4 = *(undefined4 *)
             &(pBVar8->names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = *(undefined4 *)
             ((long)&(pBVar8->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)
     &(pBVar9->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
         *(undefined4 *)
          &(pBVar8->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)
     ((long)&(pBVar9->names).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = uVar3;
    *(undefined4 *)
     &(pBVar9->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = uVar4;
    *(undefined4 *)
     ((long)&(pBVar9->names).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar5;
    (pBVar9->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pBVar8->names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pBVar8->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar8->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar8->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((LogicalOperator *)local_1c0._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_1c0._0_8_ + 8))();
    }
    if ((__buckets_ptr)local_1c0._24_8_ != (__buckets_ptr)0x0) {
      (*(code *)(*(__node_base_ptr *)local_1c0._24_8_)[1]._M_nxt)();
    }
    if (local_188._M_head_impl != (BaseTableRef *)0x0) {
      (*((local_188._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
    }
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
              (&local_60);
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
    if ((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)local_a8._M_p !=
        local_98) {
      operator_delete(local_a8._M_p);
    }
    if ((__node_base_ptr)local_c8._0_8_ != (__node_base_ptr)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
    if ((_Hash_node_base *)local_120._0_8_ != (_Hash_node_base *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    local_100._0_8_ = &PTR__UniqueConstraint_02440b10;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + 0x18));
    Constraint::~Constraint((Constraint *)local_100);
    if (local_1c8._M_head_impl != (CreateIndexInfo *)0x0) {
      (*((local_1c8._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    if (local_180 != (undefined1  [8])0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_180)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    return pBVar9;
  }
  this_06 = (BinderException *)__cxa_allocate_exception(0x10);
  local_178._0_8_ = local_178 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_180 + 8),"can only add an index to a base table","");
  BinderException::BinderException(this_06,(string *)(local_180 + 8));
  __cxa_throw(this_06,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::BindAlterAddIndex(BoundStatement &result, CatalogEntry &entry,
                                         unique_ptr<AlterInfo> alter_info) {
	auto &table_info = alter_info->Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &table = entry.Cast<TableCatalogEntry>();
	auto &column_list = table.GetColumns();

	auto bound_constraint = BindUniqueConstraint(*constraint_info.constraint, table_info.name, column_list);
	auto &bound_unique = bound_constraint->Cast<BoundUniqueConstraint>();

	// Create the CreateIndexInfo.
	auto create_index_info = make_uniq<CreateIndexInfo>();
	create_index_info->table = table_info.name;
	create_index_info->index_type = ART::TYPE_NAME;
	create_index_info->constraint_type = IndexConstraintType::PRIMARY;

	for (const auto &physical_index : bound_unique.keys) {
		auto &col = column_list.GetColumn(physical_index);
		unique_ptr<ParsedExpression> parsed = make_uniq<ColumnRefExpression>(col.GetName(), table_info.name);
		create_index_info->expressions.push_back(parsed->Copy());
		create_index_info->parsed_expressions.push_back(parsed->Copy());
	}

	auto unique_constraint = constraint_info.constraint->Cast<UniqueConstraint>();
	auto index_name = unique_constraint.GetName(table_info.name);
	create_index_info->index_name = index_name;
	D_ASSERT(!create_index_info->index_name.empty());

	// Plan the table scan.
	TableDescription table_description(table_info.catalog, table_info.schema, table_info.name);
	auto table_ref = make_uniq<BaseTableRef>(table_description);
	auto bound_table = Bind(*table_ref);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("can only add an index to a base table");
	}
	auto plan = CreatePlan(*bound_table);
	auto &get = plan->Cast<LogicalGet>();
	get.names = column_list.GetColumnNames();

	auto alter_table_info = unique_ptr_cast<AlterInfo, AlterTableInfo>(std::move(alter_info));
	result.plan = table.catalog.BindAlterAddIndex(*this, table, std::move(plan), std::move(create_index_info),
	                                              std::move(alter_table_info));
	return std::move(result);
}